

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O1

bool __thiscall ValueType::HasBeenPrimitive(ValueType *this)

{
  Type TVar1;
  
  TVar1 = Null|Undefined;
  if (((this->field_0).bits & Object) == 0) {
    TVar1 = Simd|PrimitiveOrObject|Symbol|String|Boolean|Number|Float|Int|Null|Undefined;
  }
  return (TVar1 & (this->field_0).bits) != 0;
}

Assistant:

bool ValueType::HasBeenPrimitive() const
{
    return
        OneOn(Bits::Object)
            ?
                AnyOn(Bits::Undefined | Bits::Null)
            :
                AnyOn(
                    Bits::Undefined |
                    Bits::Null |
                    Bits::Int |
                    Bits::Float |
                    Bits::Number |
                    Bits::Boolean |
                    Bits::String |
                    Bits::Symbol |
                    Bits::PrimitiveOrObject |
                    Bits::Simd);
}